

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

bool __thiscall mkvmuxer::VideoTrack::SetStereoMode(VideoTrack *this,uint64_t stereo_mode)

{
  if ((stereo_mode < 0xc) && ((0x80fUL >> (stereo_mode & 0x3f) & 1) != 0)) {
    this->stereo_mode_ = stereo_mode;
  }
  return stereo_mode == 0xb || stereo_mode < 4;
}

Assistant:

bool VideoTrack::SetStereoMode(uint64_t stereo_mode) {
  if (stereo_mode != kMono && stereo_mode != kSideBySideLeftIsFirst &&
      stereo_mode != kTopBottomRightIsFirst &&
      stereo_mode != kTopBottomLeftIsFirst &&
      stereo_mode != kSideBySideRightIsFirst)
    return false;

  stereo_mode_ = stereo_mode;
  return true;
}